

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.c
# Opt level: O2

argparse_result_t argparse_exec(int argc,char **argv,argparse_callback_fn *callback)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  argparse_result_t aVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  adt_str_t long_name;
  adt_str_t short_name;
  adt_str_t str;
  
  aVar5 = ARGPARSE_SUCCESS;
  if (1 < argc) {
    if (callback == (argparse_callback_fn *)0x0 || argv == (char **)0x0) {
      aVar5 = ARGPARSE_INVALID_ARGUMENT_ERROR;
    }
    else {
      adt_str_create(&str);
      adt_str_create(&short_name);
      adt_str_create(&long_name);
      bVar2 = false;
      bVar1 = false;
      for (uVar8 = 1; uVar8 != (uint)argc; uVar8 = uVar8 + 1) {
        pcVar6 = argv[uVar8];
        adt_str_clear(&str);
        lVar10 = 0;
        pcVar11 = pcVar6;
        while( true ) {
          pcVar11 = pcVar11 + 1;
          cVar3 = pcVar6[lVar10];
          if (cVar3 != '-') break;
          lVar10 = lVar10 + 1;
        }
        while ((cVar3 != '\0' && (cVar3 != '='))) {
          adt_str_push(&str);
          cVar3 = *pcVar11;
          pcVar11 = pcVar11 + 1;
        }
        iVar4 = adt_str_length(&str);
        uVar9 = (uint)lVar10;
        if (uVar9 < 3 && 0 < iVar4) {
          if (uVar9 != 2) {
            if (uVar9 == 1) {
              if (cVar3 != '=') {
                pcVar6 = (char *)adt_str_cstr(&str);
                aVar5 = (*callback)(pcVar6,(char *)0x0,(char *)0x0);
                if (aVar5 != ARGPARSE_NEED_VALUE) goto LAB_00102620;
                cVar3 = adt_str_set(&short_name);
                bVar1 = true;
                goto LAB_001025a9;
              }
              cVar3 = adt_str_set(&short_name,&str);
              if (cVar3 != '\0') goto LAB_00102643;
              adt_str_clear(&str);
              for (; *pcVar11 != '\0'; pcVar11 = pcVar11 + 1) {
                adt_str_push(&str);
              }
              pcVar11 = (char *)adt_str_cstr(&short_name);
              pcVar7 = (char *)adt_str_cstr(&str);
            }
            else if (bVar1) {
              pcVar11 = (char *)adt_str_cstr(&short_name);
              pcVar7 = (char *)adt_str_cstr(&str);
              bVar1 = false;
            }
            else {
              if (bVar2) {
                pcVar6 = (char *)adt_str_cstr(&long_name);
                pcVar7 = (char *)adt_str_cstr(&str);
                bVar2 = false;
                goto LAB_00102608;
              }
              pcVar7 = (char *)adt_str_cstr(&str);
              pcVar11 = (char *)0x0;
            }
            pcVar6 = (char *)0x0;
            goto LAB_0010261e;
          }
          if (cVar3 == '=') {
            cVar3 = adt_str_set(&long_name,&str);
            if (cVar3 == '\0') {
              adt_str_clear(&str);
              for (; *pcVar11 != '\0'; pcVar11 = pcVar11 + 1) {
                adt_str_push(&str);
              }
              pcVar6 = (char *)adt_str_cstr(&long_name);
              pcVar7 = (char *)adt_str_cstr(&str);
LAB_00102608:
              pcVar11 = (char *)0x0;
              goto LAB_0010261e;
            }
LAB_00102643:
            aVar5 = ARGPARSE_MEM_ERROR;
            goto LAB_00102647;
          }
          pcVar6 = (char *)adt_str_cstr(&str);
          aVar5 = (*callback)((char *)0x0,pcVar6,(char *)0x0);
          if (aVar5 != ARGPARSE_NEED_VALUE) goto LAB_00102620;
          cVar3 = adt_str_set(&long_name,&str);
          bVar2 = true;
LAB_001025a9:
          if (cVar3 != '\0') goto LAB_00102643;
        }
        else {
          if ((iVar4 != 0) || (uVar9 != 1)) {
            aVar5 = ARGPARSE_PARSE_ERROR;
            goto LAB_00102647;
          }
          if (bVar1) {
            pcVar11 = (char *)adt_str_cstr(&short_name);
            bVar1 = false;
            pcVar6 = (char *)0x0;
            pcVar7 = "-";
          }
          else {
            if (bVar2) {
              pcVar6 = (char *)adt_str_cstr(&long_name);
              bVar2 = false;
            }
            else {
              pcVar6 = (char *)0x0;
            }
            pcVar11 = (char *)0x0;
            pcVar7 = "-";
          }
LAB_0010261e:
          aVar5 = (*callback)(pcVar11,pcVar6,pcVar7);
LAB_00102620:
          if (aVar5 < ARGPARSE_SUCCESS) goto LAB_00102647;
        }
      }
      aVar5 = ARGPARSE_SUCCESS;
LAB_00102647:
      adt_str_destroy(&str);
      adt_str_destroy(&short_name);
      adt_str_destroy(&long_name);
    }
  }
  return aVar5;
}

Assistant:

argparse_result_t argparse_exec(int argc, const char **argv, argparse_callback_fn *callback)
{
   if ( argc < 2)
   {
      return ARGPARSE_SUCCESS; //Nothing to parse
   }
   if ( (argv != 0) && (callback != 0) )
   {
      int arg_id;
      adt_str_t short_name;
      adt_str_t long_name;
      adt_str_t str;
      bool has_short_name = false;
      bool has_long_name = false;
      adt_str_create(&str);
      adt_str_create(&short_name);
      adt_str_create(&long_name);

      for (arg_id = 1; arg_id < argc; arg_id++)
      {
         char c;
         int arg_len;
         unsigned int minus_count = 0u;
         unsigned int equal_count = 0u;
         const char *p = argv[arg_id];
         adt_str_clear(&str);
         for(c= *p; c == '-'; c = *(++p))
         {
            minus_count++;
         }
         for(c = *p; (c != '\0') && (c != '='); c = *(++p))
         {
            adt_str_push(&str, c);
         }
         if (c == '=')
         {
            equal_count++;
            p++;
         }
         arg_len = adt_str_length(&str);
         if ( (arg_len > 0) && (minus_count <= 2u))
         {
            argparse_result_t result = ARGPARSE_PARSE_ERROR;
            switch(minus_count)
            {
            case 0u:
               if (has_short_name)
               {
                  has_short_name = false;
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else if (has_long_name)
               {
                  has_long_name = false;
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //positional argument
                  result = callback((const char*) 0, (const char*) 0, adt_str_cstr(&str));
               }
               break;
            case 1u:
               if (equal_count == 0)
               {
                  result = callback(adt_str_cstr(&str), (const char*) 0, (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&short_name, &str);
                     has_short_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&short_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            case 2u:
               if (equal_count==0)
               {
                  result = callback((const char*) 0, adt_str_cstr(&str), (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&long_name, &str);
                     has_long_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&long_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            }
            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else if ((arg_len == 0) && (minus_count == 1))
         {
            /* A standalone minus sign is sometimes used as a positional argument to mean
               stdin/stdout instead of a file name. */

            argparse_result_t result;
            if (has_short_name)
            {
               has_short_name = false;
               result = callback(adt_str_cstr(&short_name), (const char*) 0, "-");
            }
            else if (has_long_name)
            {
               has_long_name = false;
               result = callback((const char*) 0, adt_str_cstr(&long_name), "-");
            }
            else
            {
               result = callback((const char*) 0, (const char*) 0, "-");
            }

            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else
         {
            //User gave empty arg or just typed minus sign(s) with nothing following it or typed three or more minus signs.
            ARGPARSE_DESTROY_VARS();
            return ARGPARSE_PARSE_ERROR;
         }
      }
      ARGPARSE_DESTROY_VARS();
      return ARGPARSE_SUCCESS;
   }
   return ARGPARSE_INVALID_ARGUMENT_ERROR;
}